

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_refinement.cpp
# Opt level: O3

void __thiscall duckdb::CSVSniffer::RefineTypes(CSVSniffer *this)

{
  vector<duckdb::LogicalType,_true> *this_00;
  size_type __n;
  pointer pLVar1;
  pointer pLVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined8 uVar5;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this_01;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_02;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  pointer pSVar10;
  CSVStateMachine *pCVar11;
  mapped_type *pmVar12;
  reference pvVar13;
  undefined4 extraout_var;
  DataChunk *this_03;
  long lVar14;
  reference parse_chunk_col;
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
  *puVar15;
  LogicalType *pLVar16;
  pointer pLVar17;
  key_type local_90;
  LogicalType local_88;
  LogicalType local_70;
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
  *local_58;
  CSVStateMachine *local_50;
  ulong local_48;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *local_40;
  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_38;
  
  puVar15 = &this->best_candidate;
  pSVar10 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
            ::operator->(puVar15);
  pCVar11 = BaseScanner::GetStateMachine(&pSVar10->super_BaseScanner);
  this_00 = &this->detected_types;
  __n = (pCVar11->dialect_options).num_cols;
  LogicalType::LogicalType(&local_88,VARCHAR);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::_M_fill_assign
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00,__n,
             &local_88);
  LogicalType::~LogicalType(&local_88);
  if (pCVar11->options->all_varchar == false) {
    local_40 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00;
    if (1 < pCVar11->options->sample_size_chunks) {
      local_38 = (_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&this->best_sql_types_candidates_per_column_idx;
      local_48 = 1;
      local_58 = puVar15;
      local_50 = pCVar11;
      do {
        puVar15 = local_58;
        pSVar10 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                  ::operator->(local_58);
        bVar6 = BaseScanner::FinishedFile(&pSVar10->super_BaseScanner);
        if (bVar6) {
          pLVar1 = (this->detected_types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pLVar2 = (this->detected_types).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pLVar17 = pLVar1;
          if (pLVar2 != pLVar1) {
            do {
              LogicalType::~LogicalType(pLVar17);
              pLVar17 = pLVar17 + 1;
            } while (pLVar17 != pLVar2);
            (this->detected_types).
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish = pLVar1;
          }
          this_01 = local_40;
          pCVar11 = local_50;
          local_90 = 0;
          if ((this->best_sql_types_candidates_per_column_idx)._M_h._M_element_count != 0) {
            do {
              this_02 = local_38;
              pmVar12 = ::std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[](local_38,&local_90);
              pvVar13 = vector<duckdb::LogicalType,_true>::back(pmVar12);
              LogicalType::LogicalType(&local_88,pvVar13);
              pmVar12 = ::std::__detail::
                        _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                        ::operator[](this_02,&local_90);
              if ((long)(pmVar12->
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pmVar12->
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start ==
                  (long)(pCVar11->options->auto_type_candidates).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pCVar11->options->auto_type_candidates).
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_start) {
                LogicalType::LogicalType(&local_70,VARCHAR);
                uVar5 = local_70._0_8_;
                _Var4._M_pi = local_88.type_info_.internal.
                              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi;
                peVar3 = local_88.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr;
                local_88.id_ = local_70.id_;
                local_88.physical_type_ = local_70.physical_type_;
                local_88.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     local_70.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                local_88.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = local_70.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
                local_70.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     peVar3;
                local_70.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = _Var4._M_pi;
                local_70._0_8_ = uVar5;
                LogicalType::~LogicalType(&local_70);
              }
              ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                        (this_01,&local_88);
              LogicalType::~LogicalType(&local_88);
              local_90 = local_90 + 1;
            } while (local_90 <
                     (this->best_sql_types_candidates_per_column_idx)._M_h._M_element_count);
          }
        }
        else {
          pSVar10 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                    ::operator->(puVar15);
          iVar9 = (*(pSVar10->super_BaseScanner)._vptr_BaseScanner[2])(pSVar10);
          this_03 = StringValueResult::ToChunk((StringValueResult *)CONCAT44(extraout_var,iVar9));
          local_70.id_ = INVALID;
          local_70.physical_type_ = ~INVALID;
          local_70._2_6_ = 0;
          if ((this_03->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              (this_03->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
              super__Vector_impl_data._M_start) {
LAB_0165f5a0:
            pmVar12 = ::std::__detail::
                      _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[](local_38,(key_type *)&local_70);
            pvVar13 = vector<duckdb::LogicalType,_true>::back(pmVar12);
            LogicalType::LogicalType(&local_88,BOOLEAN);
            bVar7 = LogicalType::operator==(pvVar13,&local_88);
            LogicalType::~LogicalType(&local_88);
            lVar14 = (long)(pmVar12->
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pmVar12->
                           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            while (1 < (ulong)((lVar14 >> 3) * -0x5555555555555555)) {
              pvVar13 = vector<duckdb::LogicalType,_true>::back(pmVar12);
              parse_chunk_col =
                   vector<duckdb::Vector,_true>::operator[](&this_03->data,local_70._0_8_);
              bVar8 = TryCastVector(this,parse_chunk_col,this_03->count,pvVar13);
              if (bVar8) break;
              pvVar13 = vector<duckdb::LogicalType,_true>::back(pmVar12);
              LogicalType::LogicalType(&local_88,BOOLEAN);
              bVar8 = LogicalType::operator==(pvVar13,&local_88);
              LogicalType::~LogicalType(&local_88);
              if (bVar8 && bVar7) goto LAB_0165f6b1;
              pLVar16 = (pmVar12->
                        super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                        super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1;
              (pmVar12->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish = pLVar16;
              LogicalType::~LogicalType(pLVar16);
              lVar14 = (long)(pmVar12->
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ).
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pmVar12->
                             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ).
                             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                             ._M_impl.super__Vector_impl_data._M_start;
            }
            goto LAB_0165f6e4;
          }
LAB_0165f719:
          DataChunk::Reset(this_03);
          this_03->capacity = 0x800;
          pCVar11 = local_50;
        }
        if (bVar6) {
          return;
        }
        local_48 = local_48 + 1;
        puVar15 = local_58;
      } while (local_48 < pCVar11->options->sample_size_chunks);
    }
    pLVar1 = (this->detected_types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    pLVar2 = (this->detected_types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar17 = pLVar1;
    if (pLVar2 != pLVar1) {
      do {
        LogicalType::~LogicalType(pLVar17);
        pLVar17 = pLVar17 + 1;
      } while (pLVar17 != pLVar2);
      (this->detected_types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
      .super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
      super__Vector_impl_data._M_finish = pLVar1;
    }
    local_90 = 0;
    if ((this->best_sql_types_candidates_per_column_idx)._M_h._M_element_count != 0) {
      do {
        pmVar12 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->best_sql_types_candidates_per_column_idx,&local_90);
        pvVar13 = vector<duckdb::LogicalType,_true>::back(pmVar12);
        LogicalType::LogicalType(&local_88,pvVar13);
        pmVar12 = ::std::__detail::
                  _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->best_sql_types_candidates_per_column_idx,&local_90);
        pLVar1 = (pmVar12->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pLVar2 = (pmVar12->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
                 super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pSVar10 = unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
                  ::operator->(puVar15);
        pCVar11 = BaseScanner::GetStateMachine(&pSVar10->super_BaseScanner);
        if (((long)pLVar1 - (long)pLVar2 ==
             (long)(pCVar11->options->auto_type_candidates).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pCVar11->options->auto_type_candidates).
                   super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                   _M_impl.super__Vector_impl_data._M_start) &&
           (this->default_null_to_varchar == true)) {
          LogicalType::LogicalType(&local_70,VARCHAR);
          uVar5 = local_70._0_8_;
          _Var4._M_pi = local_88.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          peVar3 = local_88.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_88.id_ = local_70.id_;
          local_88.physical_type_ = local_70.physical_type_;
          local_88.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               local_70.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_88.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_70.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          local_70.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
          local_70.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               _Var4._M_pi;
          local_70._0_8_ = uVar5;
          LogicalType::~LogicalType(&local_70);
        }
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (local_40,&local_88);
        LogicalType::~LogicalType(&local_88);
        local_90 = local_90 + 1;
      } while (local_90 < (this->best_sql_types_candidates_per_column_idx)._M_h._M_element_count);
    }
  }
  return;
LAB_0165f6b1:
  while( true ) {
    pvVar13 = vector<duckdb::LogicalType,_true>::back(pmVar12);
    LogicalType::LogicalType(&local_88,VARCHAR);
    bVar7 = LogicalType::operator==(pvVar13,&local_88);
    LogicalType::~LogicalType(&local_88);
    if (bVar7) break;
    pLVar16 = (pmVar12->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish + -1;
    (pmVar12->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
    super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish = pLVar16;
    LogicalType::~LogicalType(pLVar16);
  }
LAB_0165f6e4:
  local_70._0_8_ = local_70._0_8_ + 1;
  if ((ulong)(((long)(this_03->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this_03->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5) <=
      (ulong)local_70._0_8_) goto LAB_0165f719;
  goto LAB_0165f5a0;
}

Assistant:

void CSVSniffer::RefineTypes() {
	auto &sniffing_state_machine = best_candidate->GetStateMachine();
	// if data types were provided, exit here if number of columns does not match
	detected_types.assign(sniffing_state_machine.dialect_options.num_cols, LogicalType::VARCHAR);
	if (sniffing_state_machine.options.all_varchar) {
		// return all types varchar
		return;
	}
	for (idx_t i = 1; i < sniffing_state_machine.options.sample_size_chunks; i++) {
		bool finished_file = best_candidate->FinishedFile();
		if (finished_file) {
			// we finished the file: stop
			// set sql types
			detected_types.clear();
			for (idx_t column_idx = 0; column_idx < best_sql_types_candidates_per_column_idx.size(); column_idx++) {
				LogicalType d_type = best_sql_types_candidates_per_column_idx[column_idx].back();
				if (best_sql_types_candidates_per_column_idx[column_idx].size() ==
				    sniffing_state_machine.options.auto_type_candidates.size()) {
					d_type = LogicalType::VARCHAR;
				}
				detected_types.push_back(d_type);
			}
			return;
		}
		auto &parse_chunk = best_candidate->ParseChunk().ToChunk();

		for (idx_t col = 0; col < parse_chunk.ColumnCount(); col++) {
			vector<LogicalType> &col_type_candidates = best_sql_types_candidates_per_column_idx[col];
			bool is_bool_type = col_type_candidates.back() == LogicalType::BOOLEAN;
			while (col_type_candidates.size() > 1) {
				const auto &sql_type = col_type_candidates.back();
				if (TryCastVector(parse_chunk.data[col], parse_chunk.size(), sql_type)) {
					break;
				}
				if (col_type_candidates.back() == LogicalType::BOOLEAN && is_bool_type) {
					// If we thought this was a boolean value (i.e., T,F, True, False) and it is not, we
					// immediately pop to varchar.
					while (col_type_candidates.back() != LogicalType::VARCHAR) {
						col_type_candidates.pop_back();
					}
					break;
				}
				col_type_candidates.pop_back();
			}
		}
		// reset parse chunk for the next iteration
		parse_chunk.Reset();
		parse_chunk.SetCapacity(CSVReaderOptions::sniff_size);
	}
	detected_types.clear();
	// set sql types
	for (idx_t column_idx = 0; column_idx < best_sql_types_candidates_per_column_idx.size(); column_idx++) {
		LogicalType d_type = best_sql_types_candidates_per_column_idx[column_idx].back();
		if (best_sql_types_candidates_per_column_idx[column_idx].size() ==
		        best_candidate->GetStateMachine().options.auto_type_candidates.size() &&
		    default_null_to_varchar) {
			d_type = LogicalType::VARCHAR;
		}
		detected_types.push_back(d_type);
	}
}